

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::FastAdder::Add(FastAdder *this,uint *val)

{
  uint uVar1;
  RepeatedField<unsigned_int> *this_00;
  uint *puVar2;
  int iVar3;
  
  iVar3 = this->index_;
  if (iVar3 == this->capacity_) {
    this_00 = this->repeated_field_;
    this_00->current_size_ = iVar3;
    Reserve(this_00,iVar3 + 1);
    this->capacity_ = this->repeated_field_->total_size_;
    puVar2 = (uint *)this->repeated_field_->arena_or_elements_;
    this->buffer_ = puVar2;
    iVar3 = this->index_;
  }
  else {
    puVar2 = this->buffer_;
  }
  uVar1 = *val;
  this->index_ = iVar3 + 1;
  puVar2[iVar3] = uVar1;
  return;
}

Assistant:

void Add(const Element& val) {
      if (kIsPod) {
        if (index_ == capacity_) {
          repeated_field_->current_size_ = index_;
          repeated_field_->Reserve(index_ + 1);
          capacity_ = repeated_field_->total_size_;
          buffer_ = repeated_field_->unsafe_elements();
        }
        buffer_[index_++] = val;
      } else {
        repeated_field_->Add(val);
      }
    }